

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitStringWTF16Get
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::PrecomputingExpressionRunner> *this,
          StringWTF16Get *curr)

{
  uint uVar1;
  Literal *pLVar2;
  long lVar3;
  long lVar4;
  Type TVar5;
  shared_ptr<wasm::GCData> sVar6;
  undefined1 local_100 [8];
  Flow ref;
  Flow pos;
  undefined1 local_58 [8];
  Literal refValue;
  shared_ptr<wasm::GCData> data;
  
  visit((Flow *)local_100,this,curr->ref);
  if (ref.breakTo.super_IString.str._M_len == 0) {
    visit((Flow *)&ref.breakTo.super_IString.str._M_str,this,curr->pos);
    if (pos.breakTo.super_IString.str._M_len == 0) {
      pLVar2 = Flow::getSingleValue((Flow *)local_100);
      Literal::Literal((Literal *)local_58,pLVar2);
      sVar6 = Literal::getGCData((Literal *)&refValue.type);
      TVar5 = refValue.type;
      if (refValue.type.id == 0) {
        (*this->_vptr_ExpressionRunner[2])
                  (this,"null ref",
                   sVar6.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi._M_pi);
        TVar5 = refValue.type;
      }
      pLVar2 = Flow::getSingleValue((Flow *)&ref.breakTo.super_IString.str._M_str);
      uVar1 = Literal::geti32(pLVar2);
      lVar4 = *(long *)(TVar5.id + 0x28);
      lVar3 = *(long *)(TVar5.id + 0x30) - lVar4;
      if ((ulong)(lVar3 / 0x18 + *(long *)(TVar5.id + 8)) <= (ulong)uVar1) {
        (*this->_vptr_ExpressionRunner[2])(this,"string oob",lVar3 % 0x18);
        lVar4 = *(long *)(TVar5.id + 0x28);
      }
      pLVar2 = (Literal *)(lVar4 + -0x18 + (ulong)uVar1 * 0x18);
      if (uVar1 == 0) {
        pLVar2 = (Literal *)(TVar5.id + 0x10);
      }
      pos.breakTo.super_IString.str._M_str._0_4_ = Literal::geti32(pLVar2);
      Flow::Flow(__return_storage_ptr__,(Literal *)&pos.breakTo.super_IString.str._M_str);
      Literal::~Literal((Literal *)&pos.breakTo.super_IString.str._M_str);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&data);
      Literal::~Literal((Literal *)local_58);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)&ref.breakTo.super_IString.str._M_str);
    }
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&ref.breakTo.super_IString.str._M_str);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_100);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_100);
  return __return_storage_ptr__;
}

Assistant:

Flow visitStringWTF16Get(StringWTF16Get* curr) {
    NOTE_ENTER("StringWTF16Get");
    Flow ref = visit(curr->ref);
    if (ref.breaking()) {
      return ref;
    }
    Flow pos = visit(curr->pos);
    if (pos.breaking()) {
      return pos;
    }
    auto refValue = ref.getSingleValue();
    auto data = refValue.getGCData();
    if (!data) {
      trap("null ref");
    }
    auto& values = data->values;
    Index i = pos.getSingleValue().geti32();
    if (i >= values.size()) {
      trap("string oob");
    }

    return Literal(values[i].geti32());
  }